

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O2

void __thiscall Markov::Connection::TrainPart(Connection *this,string_view src,TrainData *td)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *this_00;
  string_view src_00;
  basic_string_view<char,_std::char_traits<char>_> __args;
  regex_type nline;
  sviterator iter;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_b8;
  
  if ((td->conf).splitstr == true) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&nline,"\\n+",0x10);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_token_iterator(&iter,src._M_str,src._M_str + src._M_len,&nline,-1,0);
    while (this_00 = &iter,
          bVar2 = std::__cxx11::
                  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                  operator!=(&iter,&td->badIter), bVar2) {
      pcVar3 = ((iter._M_result)->super_pair<const_char_*,_const_char_*>).first;
      pcVar1 = ((iter._M_result)->super_pair<const_char_*,_const_char_*>).second + -(long)pcVar3;
      if (((iter._M_result)->matched & 1U) == 0) {
        pcVar3 = (char *)0x0;
        pcVar1 = (char *)0x0;
      }
      src_00._M_str = pcVar3;
      src_00._M_len = (size_t)pcVar1;
      TrainFinal((Connection *)this_00,src_00,td);
      __args._M_str = "\n";
      __args._M_len = 1;
      std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>::operator()
                (&td->func,__args,false);
      std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      operator++(&local_b8,&iter,0);
      std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      ~regex_token_iterator(&local_b8);
    }
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_token_iterator(&iter);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&nline);
  }
  else {
    TrainFinal(this,src,td);
  }
  std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>::operator()
            (&td->func,(basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x1497ed) << 0x40)
             ,true);
  return;
}

Assistant:

void Connection::TrainPart(std::string_view src, const TrainData& td) {
		if (td.conf.splitstr) {
				regex_type nline("\\n+");

				for (auto iter = sviterator(src.begin(), src.end(), nline, -1); iter != td.badIter; iter++) {
						TrainFinal(matchToSv(*iter), td);
						td.func("\n", false);
						}
				}
		else {
				TrainFinal(src, td);
				}

		td.func("", true);
		}